

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  uint file;
  uv_loop_t *puVar8;
  uv_loop_t *puVar9;
  uv_process_options_t *puVar10;
  int extraout_EDX;
  char *pcVar11;
  char *pcVar12;
  uv__queue *unaff_RBP;
  int iVar13;
  undefined1 *puVar14;
  uv_handle_t *puVar15;
  uv_process_options_t *unaff_R14;
  uv__queue *unaff_R15;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStackY_f40 [48];
  uv_loop_t *puStackY_f10;
  long lStackY_f00;
  long lStackY_ef8;
  uv_loop_t *puStackY_ef0;
  uv_process_options_t *puStackY_ee8;
  long lStackY_ed8;
  long lStackY_ed0;
  uv_os_fd_t uStackY_ec4;
  uv_stdio_container_t uStackY_ec0;
  undefined4 uStackY_eb0;
  undefined4 uStackY_ea8;
  undefined4 uStackY_ea0;
  undefined4 uStackY_e98;
  undefined4 uStackY_e90;
  uv_os_fd_t uStackY_e88;
  sockaddr_in sStackY_e80;
  uv_loop_t *puStackY_e70;
  undefined8 uStackY_e68;
  long lStackY_e60;
  uv_tcp_t uStackY_e58;
  long lStackY_d80;
  long lStackY_d78;
  uv_stdio_container_t uStackY_d70;
  undefined4 uStackY_d60;
  undefined4 uStackY_d50;
  undefined4 uStackY_d40;
  uv_loop_t *puStackY_d38;
  undefined1 auStackY_d28 [296];
  undefined1 auStackY_c00 [16];
  char acStackY_bf0 [32];
  uv_stdio_container_t uStackY_bd0;
  undefined4 uStackY_bc0;
  uv_loop_t *puStackY_bb8;
  uv_write_t uStackY_ba8;
  uv_stream_t uStackY_ae0;
  uv_stream_t uStackY_9f8;
  uv_loop_t *puStackY_910;
  uv_fs_t *puStackY_908;
  uv__queue *puStackY_900;
  uv_buf_t uStack_8d8;
  uv_rwlock_t uStack_8c8;
  uv_fs_t uStack_890;
  uv_loop_t *puStack_6d0;
  uv_fs_t *puStack_6c8;
  uv_buf_t uStack_690;
  uv_stdio_container_t uStack_680;
  undefined4 uStack_670;
  uint uStack_668;
  undefined4 uStack_660;
  uint uStack_658;
  uv_fs_t uStack_650;
  uv_loop_t *puStack_490;
  uv_fs_t *puStack_488;
  uv_buf_t uStack_458;
  uv_stdio_container_t uStack_448;
  undefined4 uStack_438;
  uint uStack_430;
  undefined4 uStack_428;
  uint uStack_420;
  uv_fs_t uStack_410;
  uv_loop_t *puStack_250;
  uv_fs_t *puStack_248;
  uv_buf_t uStack_220;
  uv_stdio_container_t uStack_210;
  undefined4 uStack_200;
  uint uStack_1f8;
  uv_fs_t uStack_1e8;
  
  uStack_8d8.len = (size_t)uStack_8d8.base;
  uStack_690.len = (size_t)uStack_690.base;
  uStack_458.len = (size_t)uStack_458.base;
  uStack_220.len = (size_t)uStack_220.base;
  if (0 < nread) {
    output_used = output_used + (int)nread;
    return;
  }
  if (-1 < nread) {
    return;
  }
  if (nread == -0xfff) {
    uv_close((uv_handle_t *)tcp,close_cb);
    return;
  }
  on_read_cold_1();
  pcVar11 = "stdout_file";
  puStack_248 = (uv_fs_t *)0x1bb84a;
  unlink("stdout_file");
  puStack_248 = (uv_fs_t *)0x1bb85d;
  init_process_options("spawn_helper2",exit_cb);
  puStack_248 = (uv_fs_t *)0x1bb87a;
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_1e8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uStack_210._0_8_ = SEXT48(iVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_220.len;
  uStack_220 = (uv_buf_t)(auVar2 << 0x40);
  if (uStack_210._0_8_ == 0) {
    pcVar11 = (char *)(ulong)(uint)uStack_1e8.result;
    puStack_248 = (uv_fs_t *)0x1bb8a7;
    uv_fs_req_cleanup(&uStack_1e8);
    options.stdio = &uStack_210;
    unaff_R14 = &options;
    uStack_210._0_8_ = uStack_210._0_8_ & 0xffffffff00000000;
    uStack_200 = 2;
    uStack_1f8 = (uint)uStack_1e8.result;
    options.stdio_count = 2;
    puStack_248 = (uv_fs_t *)0x1bb8d6;
    puVar8 = uv_default_loop();
    puStack_248 = (uv_fs_t *)0x1bb8e8;
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_220.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbae6;
    puStack_248 = (uv_fs_t *)0x1bb90d;
    puVar8 = uv_default_loop();
    puStack_248 = (uv_fs_t *)0x1bb917;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_220.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbaf5;
    uStack_220.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bbb04;
    uStack_220.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bbb13;
    puStack_248 = (uv_fs_t *)0x1bb992;
    uStack_220 = uv_buf_init(output,0x400);
    puStack_248 = (uv_fs_t *)0x1bb9bd;
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_1e8,(uint)uStack_1e8.result,&uStack_220,1,0,
                       (uv_fs_cb)0x0);
    if (iVar6 != 0xc) goto LAB_001bbb22;
    unaff_R14 = (uv_process_options_t *)&uStack_1e8;
    puStack_248 = (uv_fs_t *)0x1bb9ea;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    puStack_248 = (uv_fs_t *)0x1bb9f8;
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,(uint)uStack_1e8.result,(uv_fs_cb)0x0)
    ;
    if (iVar6 != 0) goto LAB_001bbb31;
    puStack_248 = (uv_fs_t *)0x1bba22;
    uv_fs_req_cleanup(&uStack_1e8);
    pcVar11 = output;
    puStack_248 = (uv_fs_t *)0x1bba3a;
    printf("output is: %s",output);
    puStack_248 = (uv_fs_t *)0x1bba49;
    iVar6 = strcmp("hello world\n",output);
    if (iVar6 != 0) goto LAB_001bbb40;
    puStack_248 = (uv_fs_t *)0x1bba75;
    unlink("stdout_file");
    puStack_248 = (uv_fs_t *)0x1bba7a;
    pcVar11 = (char *)uv_default_loop();
    puStack_248 = (uv_fs_t *)0x1bba8e;
    uv_walk((uv_loop_t *)pcVar11,close_walk_cb,(void *)0x0);
    puStack_248 = (uv_fs_t *)0x1bba98;
    uv_run((uv_loop_t *)pcVar11,UV_RUN_DEFAULT);
    puStack_248 = (uv_fs_t *)0x1bbaa6;
    puVar8 = uv_default_loop();
    puStack_248 = (uv_fs_t *)0x1bbaae;
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      puStack_248 = (uv_fs_t *)0x1bbaca;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_248 = (uv_fs_t *)0x1bbae6;
    run_test_spawn_stdout_to_file_cold_1();
LAB_001bbae6:
    puStack_248 = (uv_fs_t *)0x1bbaf5;
    run_test_spawn_stdout_to_file_cold_2();
LAB_001bbaf5:
    puStack_248 = (uv_fs_t *)0x1bbb04;
    run_test_spawn_stdout_to_file_cold_3();
LAB_001bbb04:
    puStack_248 = (uv_fs_t *)0x1bbb13;
    run_test_spawn_stdout_to_file_cold_4();
LAB_001bbb13:
    puStack_248 = (uv_fs_t *)0x1bbb22;
    run_test_spawn_stdout_to_file_cold_5();
LAB_001bbb22:
    puStack_248 = (uv_fs_t *)0x1bbb31;
    run_test_spawn_stdout_to_file_cold_6();
LAB_001bbb31:
    puStack_248 = (uv_fs_t *)0x1bbb40;
    run_test_spawn_stdout_to_file_cold_7();
LAB_001bbb40:
    puStack_248 = (uv_fs_t *)0x1bbb4f;
    run_test_spawn_stdout_to_file_cold_8();
  }
  puStack_248 = (uv_fs_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_9();
  pcVar12 = "stdout_file";
  puStack_250 = (uv_loop_t *)pcVar11;
  puStack_248 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_410,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uStack_448._0_8_ = SEXT48(iVar6);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_458.len;
  uStack_458 = (uv_buf_t)(auVar3 << 0x40);
  if (uStack_448._0_8_ == 0) {
    pcVar12 = (char *)(ulong)(uint)uStack_410.result;
    uv_fs_req_cleanup(&uStack_410);
    options.stdio = &uStack_448;
    unaff_R14 = &options;
    uStack_448._0_8_ = uStack_448._0_8_ & 0xffffffff00000000;
    uStack_438 = 2;
    uStack_430 = (uint)uStack_410.result;
    uStack_428 = 2;
    uStack_420 = (uint)uStack_410.result;
    options.stdio_count = 3;
    puVar8 = uv_default_loop();
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_458.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbe1d;
    puVar8 = uv_default_loop();
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_458.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbe2c;
    uStack_458.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bbe3b;
    uStack_458.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bbe4a;
    uStack_458 = uv_buf_init(output,0x400);
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_410,(uint)uStack_410.result,&uStack_458,1,0,
                       (uv_fs_cb)0x0);
    if (iVar6 != 0x1b) goto LAB_001bbe59;
    unaff_R14 = (uv_process_options_t *)&uStack_410;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,(uint)uStack_410.result,(uv_fs_cb)0x0)
    ;
    if (iVar6 != 0) goto LAB_001bbe68;
    uv_fs_req_cleanup(&uStack_410);
    pcVar12 = output;
    printf("output is: %s",output);
    iVar6 = strcmp("hello world\nhello errworld\n",output);
    if (iVar6 != 0) goto LAB_001bbe77;
    unlink("stdout_file");
    pcVar12 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar12,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar12,UV_RUN_DEFAULT);
    puVar8 = uv_default_loop();
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_001bbe1d:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_001bbe2c:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_001bbe3b:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_001bbe4a:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_001bbe59:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_001bbe68:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
LAB_001bbe77:
    run_test_spawn_stdout_and_stderr_to_file_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_9();
  pcVar11 = "stdout_file";
  puStack_490 = (uv_loop_t *)pcVar12;
  puStack_488 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_650,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uStack_680._0_8_ = SEXT48(iVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uStack_690.len;
  uStack_690 = (uv_buf_t)(auVar4 << 0x40);
  if (uStack_680._0_8_ == 0) {
    uv_fs_req_cleanup(&uStack_650);
    unaff_RBP = (uv__queue *)0x2;
    uVar7 = dup2((int)uStack_650.result,2);
    pcVar11 = (char *)(ulong)uVar7;
    uStack_680._0_8_ = SEXT48((int)uVar7);
    uStack_690.base = (char *)0xffffffffffffffff;
    if (uStack_680._0_8_ == -1) goto LAB_001bc184;
    options.stdio = &uStack_680;
    unaff_R14 = &options;
    uStack_680._4_4_ = (int)uVar7 >> 0x1f;
    uStack_680._0_8_ = (ulong)(uint)uStack_680._4_4_ << 0x20;
    uStack_670 = 2;
    uStack_660 = 2;
    options.stdio_count = 3;
    uStack_668 = uVar7;
    uStack_658 = uVar7;
    puVar8 = uv_default_loop();
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_690.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc193;
    puVar8 = uv_default_loop();
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_690.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc1a2;
    uStack_690.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc1b1;
    uStack_690.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc1c0;
    uStack_690 = uv_buf_init(output,0x400);
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_650,uVar7,&uStack_690,1,0,(uv_fs_cb)0x0);
    if (iVar6 != 0x1b) goto LAB_001bc1cf;
    unaff_R14 = (uv_process_options_t *)&uStack_650;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar7,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bc1de;
    uv_fs_req_cleanup(&uStack_650);
    pcVar11 = output;
    printf("output is: %s",output);
    iVar6 = strcmp("hello world\nhello errworld\n",output);
    if (iVar6 != 0) goto LAB_001bc1ed;
    unlink("stdout_file");
    pcVar11 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar11,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar11,UV_RUN_DEFAULT);
    puVar8 = uv_default_loop();
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001bc184:
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_001bc193:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001bc1a2:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001bc1b1:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001bc1c0:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001bc1cf:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001bc1de:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
LAB_001bc1ed:
    run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_9();
  pcVar12 = "stdout_file";
  puStackY_900 = (uv__queue *)0x1bc227;
  puStack_6d0 = (uv_loop_t *)pcVar11;
  puStack_6c8 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  puStackY_900 = (uv__queue *)0x1bc233;
  unlink("stderr_file");
  puStackY_900 = (uv__queue *)0x1bc246;
  init_process_options("spawn_helper6",exit_cb);
  puStackY_900 = (uv__queue *)0x1bc263;
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_890,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar7 = (uint)uStack_890.result;
  uStack_8c8.__align = (long)iVar6;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uStack_8d8.len;
  uStack_8d8 = (uv_buf_t)(auVar5 << 0x40);
  if (uStack_8c8.__align == 0) {
    pcVar12 = (char *)(ulong)(uint)uStack_890.result;
    puStackY_900 = (uv__queue *)0x1bc290;
    uv_fs_req_cleanup(&uStack_890);
    puStackY_900 = (uv__queue *)0x1bc29c;
    uVar7 = dup2(uVar7,1);
    unaff_RBP = (uv__queue *)(ulong)uVar7;
    uStack_8c8.__align = (long)(int)uVar7;
    uStack_8d8.base = (char *)0xffffffffffffffff;
    if (uStack_8c8.__align == -1) goto LAB_001bc66f;
    puStackY_900 = (uv__queue *)0x1bc2df;
    iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_890,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    uStack_8c8.__align = (long)iVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_8d8.len;
    uStack_8d8 = (uv_buf_t)(auVar1 << 0x40);
    if (uStack_8c8.__align != 0) goto LAB_001bc67e;
    puStackY_900 = (uv__queue *)0x1bc30c;
    uv_fs_req_cleanup(&uStack_890);
    unaff_R15 = (uv__queue *)0x2;
    puStackY_900 = (uv__queue *)0x1bc31e;
    file = dup2((uint)uStack_890.result,2);
    pcVar12 = (char *)(ulong)file;
    uStack_8c8.__align = (long)(int)file;
    uStack_8d8.base = (char *)0xffffffffffffffff;
    if (uStack_8c8.__align == -1) goto LAB_001bc68d;
    options.stdio = (uv_stdio_container_t *)&uStack_8c8;
    unaff_R14 = &options;
    uStack_8c8.__data.__writers = (int)file >> 0x1f;
    uStack_8c8.__align = (ulong)uStack_8c8.__data.__writers << 0x20;
    uStack_8c8.__data.__pad3 = 2;
    uStack_8c8._32_4_ = 2;
    options.stdio_count = 3;
    puStackY_900 = (uv__queue *)0x1bc376;
    uStack_8c8.__data.__cur_writer = file;
    uStack_8c8.__data.__pad2._0_4_ = uVar7;
    puVar8 = uv_default_loop();
    puStackY_900 = (uv__queue *)0x1bc388;
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_8d8.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc69c;
    puStackY_900 = (uv__queue *)0x1bc3ad;
    puVar8 = uv_default_loop();
    puStackY_900 = (uv__queue *)0x1bc3b7;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_8d8.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc6ab;
    uStack_8d8.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc6ba;
    uStack_8d8.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc6c9;
    puStackY_900 = (uv__queue *)0x1bc432;
    uStack_8d8 = uv_buf_init(output,0x400);
    puStackY_900 = (uv__queue *)0x1bc45d;
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_890,uVar7,&uStack_8d8,1,0,(uv_fs_cb)0x0);
    pcVar11 = (char *)unaff_R14;
    if (iVar6 < 0xf) goto LAB_001bc6d8;
    pcVar11 = (char *)&uStack_890;
    puStackY_900 = (uv__queue *)0x1bc48a;
    uv_fs_req_cleanup((uv_fs_t *)pcVar11);
    puStackY_900 = (uv__queue *)0x1bc498;
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)pcVar11,uVar7,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bc6e7;
    puStackY_900 = (uv__queue *)0x1bc4c2;
    uv_fs_req_cleanup(&uStack_890);
    pcVar11 = output;
    puStackY_900 = (uv__queue *)0x1bc4da;
    printf("output is: %s",output);
    puStackY_900 = (uv__queue *)0x1bc4ee;
    iVar6 = strncmp("hello errworld\n",output,0xf);
    if (iVar6 != 0) goto LAB_001bc6f6;
    puStackY_900 = (uv__queue *)0x1bc532;
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_890,file,&uStack_8d8,1,0,(uv_fs_cb)0x0);
    if (iVar6 < 0xc) goto LAB_001bc705;
    pcVar11 = (char *)&uStack_890;
    puStackY_900 = (uv__queue *)0x1bc55f;
    uv_fs_req_cleanup((uv_fs_t *)pcVar11);
    puStackY_900 = (uv__queue *)0x1bc56d;
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)pcVar11,file,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bc714;
    puStackY_900 = (uv__queue *)0x1bc597;
    uv_fs_req_cleanup(&uStack_890);
    pcVar12 = output;
    puStackY_900 = (uv__queue *)0x1bc5af;
    printf("output is: %s",output);
    puStackY_900 = (uv__queue *)0x1bc5c3;
    iVar6 = strncmp("hello world\n",output,0xc);
    if (iVar6 != 0) goto LAB_001bc723;
    puStackY_900 = (uv__queue *)0x1bc5ef;
    unlink("stdout_file");
    puStackY_900 = (uv__queue *)0x1bc5fb;
    unlink("stderr_file");
    puStackY_900 = (uv__queue *)0x1bc600;
    pcVar12 = (char *)uv_default_loop();
    puStackY_900 = (uv__queue *)0x1bc614;
    uv_walk((uv_loop_t *)pcVar12,close_walk_cb,(void *)0x0);
    puStackY_900 = (uv__queue *)0x1bc61e;
    uv_run((uv_loop_t *)pcVar12,UV_RUN_DEFAULT);
    puStackY_900 = (uv__queue *)0x1bc62c;
    puVar8 = uv_default_loop();
    puStackY_900 = (uv__queue *)0x1bc634;
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      puStackY_900 = (uv__queue *)0x1bc650;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStackY_900 = (uv__queue *)0x1bc66f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bc66f:
    puStackY_900 = (uv__queue *)0x1bc67e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bc67e:
    puStackY_900 = (uv__queue *)0x1bc68d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bc68d:
    puStackY_900 = (uv__queue *)0x1bc69c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bc69c:
    puStackY_900 = (uv__queue *)0x1bc6ab;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bc6ab:
    puStackY_900 = (uv__queue *)0x1bc6ba;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bc6ba:
    puStackY_900 = (uv__queue *)0x1bc6c9;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bc6c9:
    puStackY_900 = (uv__queue *)0x1bc6d8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    pcVar11 = (char *)unaff_R14;
LAB_001bc6d8:
    puStackY_900 = (uv__queue *)0x1bc6e7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bc6e7:
    puStackY_900 = (uv__queue *)0x1bc6f6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bc6f6:
    puStackY_900 = (uv__queue *)0x1bc705;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bc705:
    puStackY_900 = (uv__queue *)0x1bc714;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bc714:
    puStackY_900 = (uv__queue *)0x1bc723;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bc723:
    puStackY_900 = (uv__queue *)0x1bc732;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  puStackY_900 = (uv__queue *)run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar13 = (int)auStackY_d28 + 0x118;
  builtin_strncpy(acStackY_bf0,"hello-from-spawn_stdin",0x17);
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc77b;
  puStackY_910 = (uv_loop_t *)pcVar12;
  puStackY_908 = (uv_fs_t *)pcVar11;
  puStackY_900 = unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc780;
  puVar9 = uv_default_loop();
  puVar8 = (uv_loop_t *)&uStackY_9f8;
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc795;
  uv_pipe_init(puVar9,(uv_pipe_t *)puVar8,0);
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc79a;
  puVar9 = uv_default_loop();
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc7af;
  uv_pipe_init(puVar9,(uv_pipe_t *)&uStackY_ae0,0);
  options.stdio = &uStackY_bd0;
  uStackY_bd0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStackY_bc0 = 0x21;
  options.stdio_count = 2;
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc7e6;
  uStackY_bd0.data.stream = &uStackY_ae0;
  puStackY_bb8 = puVar8;
  puVar9 = uv_default_loop();
  auStackY_d28._272_8_ = (uv_async_cb)0x1bc7f8;
  iVar6 = uv_spawn(puVar9,&process,&options);
  uStackY_ba8.data = (void *)(long)iVar6;
  auStackY_c00._0_8_ = (char *)0x0;
  if ((uv__queue *)uStackY_ba8.data == (uv__queue *)0x0) {
    auStackY_c00._0_8_ = acStackY_bf0;
    auStackY_c00._8_8_ = 0x17;
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc84b;
    iVar6 = uv_write(&uStackY_ba8,&uStackY_ae0,(uv_buf_t *)auStackY_c00,1,write_cb);
    auStackY_d28._288_8_ = SEXT48(iVar6);
    auStackY_d28._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d28._288_8_ != (uv__queue *)0x0) goto LAB_001bc9b1;
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc884;
    iVar6 = uv_read_start(&uStackY_9f8,on_alloc,on_read);
    auStackY_d28._288_8_ = SEXT48(iVar6);
    auStackY_d28._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d28._288_8_ != (uv__queue *)0x0) goto LAB_001bc9be;
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc8a7;
    puVar9 = uv_default_loop();
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc8b1;
    iVar6 = uv_run(puVar9,UV_RUN_DEFAULT);
    auStackY_d28._288_8_ = SEXT48(iVar6);
    auStackY_d28._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d28._288_8_ != (uv__queue *)0x0) goto LAB_001bc9cb;
    auStackY_d28._288_8_ = (uv__queue *)0x1;
    auStackY_d28._280_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_d28._280_8_ != (uv__queue *)0x1) goto LAB_001bc9d8;
    auStackY_d28._288_8_ = (uv__queue *)0x3;
    auStackY_d28._280_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_d28._280_8_ != (uv__queue *)0x3) goto LAB_001bc9e5;
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc926;
    iVar6 = strcmp(acStackY_bf0,output);
    auStackY_d28._288_8_ = SEXT48(iVar6);
    auStackY_d28._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d28._288_8_ != (uv__queue *)0x0) goto LAB_001bc9f2;
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc949;
    puVar8 = uv_default_loop();
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc95d;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc967;
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStackY_d28._288_8_ = (uv__queue *)0x0;
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc975;
    puVar9 = uv_default_loop();
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc97d;
    iVar6 = uv_loop_close(puVar9);
    auStackY_d28._280_8_ = SEXT48(iVar6);
    if (auStackY_d28._288_8_ == auStackY_d28._280_8_) {
      auStackY_d28._272_8_ = (uv_async_cb)0x1bc993;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9b1;
    run_test_spawn_stdin_cold_1();
LAB_001bc9b1:
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9be;
    run_test_spawn_stdin_cold_2();
LAB_001bc9be:
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9cb;
    run_test_spawn_stdin_cold_3();
LAB_001bc9cb:
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9d8;
    run_test_spawn_stdin_cold_4();
LAB_001bc9d8:
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9e5;
    run_test_spawn_stdin_cold_5();
LAB_001bc9e5:
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9f2;
    run_test_spawn_stdin_cold_6();
LAB_001bc9f2:
    auStackY_d28._272_8_ = (uv_async_cb)0x1bc9ff;
    run_test_spawn_stdin_cold_7();
  }
  puVar14 = auStackY_d28 + 0x120;
  auStackY_d28._272_8_ = write_cb;
  run_test_spawn_stdin_cold_8();
  auStackY_d28._272_8_ = SEXT48(iVar13);
  auStackY_d28._264_8_ = 0;
  if ((uv_async_cb)auStackY_d28._272_8_ == (uv_async_cb)0x0) {
    uv_close(*(uv_handle_t **)(puVar14 + 0x58),close_cb);
    return;
  }
  auStackY_d28._248_8_ = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_e58.queued_fds = (void *)0x1bca6e;
  auStackY_d28._232_8_ = puVar8;
  auStackY_d28._240_8_ = &uStackY_ae0;
  auStackY_d28._248_8_ = unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_e58.queued_fds = (void *)0x1bca73;
  puVar8 = uv_default_loop();
  puVar10 = (uv_process_options_t *)auStackY_d28;
  uStackY_e58.queued_fds = (void *)0x1bca87;
  uv_pipe_init(puVar8,(uv_pipe_t *)puVar10,0);
  options.stdio = &uStackY_d70;
  uStackY_d70.flags = UV_IGNORE;
  uStackY_d60 = 0;
  uStackY_d50 = 0;
  uStackY_d40 = 0x21;
  options.stdio_count = 4;
  uStackY_e58.queued_fds = (void *)0x1bcabc;
  puStackY_d38 = (uv_loop_t *)puVar10;
  puVar8 = uv_default_loop();
  uStackY_e58.queued_fds = (void *)0x1bcace;
  iVar6 = uv_spawn(puVar8,&process,&options);
  lStackY_d78 = (long)iVar6;
  lStackY_d80 = 0;
  if (lStackY_d78 == 0) {
    uStackY_e58.queued_fds = (void *)0x1bcb04;
    iVar6 = uv_read_start((uv_stream_t *)auStackY_d28,on_alloc,on_read);
    lStackY_d78 = (long)iVar6;
    lStackY_d80 = 0;
    if (lStackY_d78 != 0) goto LAB_001bcc44;
    uStackY_e58.queued_fds = (void *)0x1bcb27;
    puVar8 = uv_default_loop();
    uStackY_e58.queued_fds = (void *)0x1bcb31;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    lStackY_d78 = (long)iVar6;
    lStackY_d80 = 0;
    if (lStackY_d78 != 0) goto LAB_001bcc51;
    lStackY_d78 = 1;
    lStackY_d80 = (long)exit_cb_called;
    if (lStackY_d80 != 1) goto LAB_001bcc5e;
    lStackY_d78 = 2;
    lStackY_d80 = (long)close_cb_called;
    if (lStackY_d80 != 2) goto LAB_001bcc6b;
    uStackY_e58.queued_fds = (void *)0x1bcbad;
    printf("output from stdio[3] is: %s",output);
    uStackY_e58.queued_fds = (void *)0x1bcbbc;
    iVar6 = strcmp("fourth stdio!\n",output);
    lStackY_d78 = (long)iVar6;
    lStackY_d80 = 0;
    puVar10 = (uv_process_options_t *)output;
    if (lStackY_d78 != 0) goto LAB_001bcc78;
    uStackY_e58.queued_fds = (void *)0x1bcbdf;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    uStackY_e58.queued_fds = (void *)0x1bcbf3;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    uStackY_e58.queued_fds = (void *)0x1bcbfd;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    lStackY_d78 = 0;
    uStackY_e58.queued_fds = (void *)0x1bcc0b;
    puVar8 = uv_default_loop();
    uStackY_e58.queued_fds = (void *)0x1bcc13;
    iVar6 = uv_loop_close(puVar8);
    lStackY_d80 = (long)iVar6;
    if (lStackY_d78 == lStackY_d80) {
      uStackY_e58.queued_fds = (void *)0x1bcc29;
      uv_library_shutdown();
      return;
    }
  }
  else {
    uStackY_e58.queued_fds = (void *)0x1bcc44;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001bcc44:
    uStackY_e58.queued_fds = (void *)0x1bcc51;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001bcc51:
    uStackY_e58.queued_fds = (void *)0x1bcc5e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001bcc5e:
    uStackY_e58.queued_fds = (void *)0x1bcc6b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001bcc6b:
    uStackY_e58.queued_fds = (void *)0x1bcc78;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001bcc78:
    uStackY_e58.queued_fds = (void *)0x1bcc85;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_e58.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_e70 = (uv_loop_t *)0x1bcc9e;
  puVar8 = uv_default_loop();
  puStackY_e70 = (uv_loop_t *)0x1bccab;
  iVar6 = uv_tcp_init(puVar8,&uStackY_e58);
  lStackY_e60 = (long)iVar6;
  uStackY_e68 = 0;
  if (lStackY_e60 == 0) {
    puStackY_e70 = (uv_loop_t *)0x1bccd4;
    iVar6 = uv_tcp_open(&uStackY_e58,3);
    lStackY_e60 = (long)iVar6;
    uStackY_e68 = 0;
    if (lStackY_e60 != 0) goto LAB_001bcd33;
    puStackY_e70 = (uv_loop_t *)0x1bccff;
    iVar6 = uv_listen((uv_stream_t *)&uStackY_e58,0x1000,(uv_connection_cb)0x0);
    lStackY_e60 = (long)iVar6;
    uStackY_e68 = 0;
    if (lStackY_e60 == 0) {
      return;
    }
  }
  else {
    puStackY_e70 = (uv_loop_t *)0x1bcd33;
    spawn_tcp_server_helper_cold_1();
LAB_001bcd33:
    puStackY_e70 = (uv_loop_t *)0x1bcd40;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_e70 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_ee8 = (uv_process_options_t *)0x1bcd65;
  puStackY_e70 = (uv_loop_t *)puVar10;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStackY_ee8 = (uv_process_options_t *)0x1bcd7b;
  iVar6 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_e80);
  uStackY_ec0._0_8_ = SEXT48(iVar6);
  lStackY_ed8 = 0;
  if (uStackY_ec0._0_8_ == 0) {
    puStackY_ee8 = (uv_process_options_t *)0x1bcda0;
    puVar8 = uv_default_loop();
    puStackY_ee8 = (uv_process_options_t *)0x1bcdb4;
    iVar6 = uv_tcp_init_ex(puVar8,&tcp_server,2);
    uStackY_ec0._0_8_ = SEXT48(iVar6);
    lStackY_ed8 = 0;
    if (uStackY_ec0._0_8_ != 0) goto LAB_001bcf99;
    puStackY_ee8 = (uv_process_options_t *)0x1bcde7;
    iVar6 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_e80,0);
    uStackY_ec0._0_8_ = SEXT48(iVar6);
    lStackY_ed8 = 0;
    if (uStackY_ec0._0_8_ != 0) goto LAB_001bcfa8;
    puStackY_ee8 = (uv_process_options_t *)0x1bce18;
    iVar6 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_ec4);
    uStackY_ec0._0_8_ = SEXT48(iVar6);
    lStackY_ed8 = 0;
    if (uStackY_ec0._0_8_ != 0) goto LAB_001bcfb7;
    options.stdio = &uStackY_ec0;
    puVar10 = &options;
    uStackY_ec0._4_4_ = iVar6 >> 0x1f;
    uStackY_ec0.flags = 2;
    uStackY_ec0.data.file = 0;
    uStackY_eb0 = 2;
    uStackY_ea8 = 1;
    uStackY_ea0 = 2;
    uStackY_e98 = 2;
    uStackY_e90 = 2;
    uStackY_e88 = uStackY_ec4;
    options.stdio_count = 4;
    puStackY_ee8 = (uv_process_options_t *)0x1bce82;
    puVar8 = uv_default_loop();
    puStackY_ee8 = (uv_process_options_t *)0x1bce94;
    iVar6 = uv_spawn(puVar8,&process,&options);
    lStackY_ed8 = (long)iVar6;
    lStackY_ed0 = 0;
    if (lStackY_ed8 != 0) goto LAB_001bcfc6;
    puStackY_ee8 = (uv_process_options_t *)0x1bceb9;
    puVar8 = uv_default_loop();
    puStackY_ee8 = (uv_process_options_t *)0x1bcec3;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    lStackY_ed8 = (long)iVar6;
    lStackY_ed0 = 0;
    if (lStackY_ed8 != 0) goto LAB_001bcfd5;
    lStackY_ed8 = 1;
    lStackY_ed0 = (long)exit_cb_called;
    if (lStackY_ed0 != 1) goto LAB_001bcfe4;
    lStackY_ed8 = 1;
    lStackY_ed0 = (long)close_cb_called;
    if (lStackY_ed0 != 1) goto LAB_001bcff3;
    puStackY_ee8 = (uv_process_options_t *)0x1bcf32;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    puStackY_ee8 = (uv_process_options_t *)0x1bcf46;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    puStackY_ee8 = (uv_process_options_t *)0x1bcf50;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    lStackY_ed8 = 0;
    puStackY_ee8 = (uv_process_options_t *)0x1bcf5e;
    puVar8 = uv_default_loop();
    puStackY_ee8 = (uv_process_options_t *)0x1bcf66;
    iVar6 = uv_loop_close(puVar8);
    lStackY_ed0 = (long)iVar6;
    if (lStackY_ed8 == lStackY_ed0) {
      puStackY_ee8 = (uv_process_options_t *)0x1bcf82;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStackY_ee8 = (uv_process_options_t *)0x1bcf99;
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf99:
    puStackY_ee8 = (uv_process_options_t *)0x1bcfa8;
    run_test_spawn_tcp_server_cold_2();
LAB_001bcfa8:
    puStackY_ee8 = (uv_process_options_t *)0x1bcfb7;
    run_test_spawn_tcp_server_cold_3();
LAB_001bcfb7:
    puStackY_ee8 = (uv_process_options_t *)0x1bcfc6;
    run_test_spawn_tcp_server_cold_4();
LAB_001bcfc6:
    puStackY_ee8 = (uv_process_options_t *)0x1bcfd5;
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfd5:
    puStackY_ee8 = (uv_process_options_t *)0x1bcfe4;
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfe4:
    puStackY_ee8 = (uv_process_options_t *)0x1bcff3;
    run_test_spawn_tcp_server_cold_7();
LAB_001bcff3:
    puStackY_ee8 = (uv_process_options_t *)0x1bd002;
    run_test_spawn_tcp_server_cold_8();
  }
  puStackY_ee8 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStackY_ee8 = &options;
  puStackY_f10 = (uv_loop_t *)0x1bd02b;
  puStackY_ef0 = (uv_loop_t *)puVar10;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar10 = &options;
  options.stdio_count = 0;
  puStackY_f10 = (uv_loop_t *)0x1bd04b;
  puVar8 = uv_default_loop();
  puStackY_f10 = (uv_loop_t *)0x1bd05d;
  iVar6 = uv_spawn(puVar8,&process,&options);
  lStackY_ef8 = (long)iVar6;
  lStackY_f00 = 0;
  if (lStackY_ef8 == 0) {
    puStackY_f10 = (uv_loop_t *)0x1bd07e;
    puVar8 = uv_default_loop();
    puStackY_f10 = (uv_loop_t *)0x1bd088;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    lStackY_ef8 = (long)iVar6;
    lStackY_f00 = 0;
    if (lStackY_ef8 != 0) goto LAB_001bd15c;
    lStackY_ef8 = 1;
    lStackY_f00 = (long)exit_cb_called;
    if (lStackY_f00 != 1) goto LAB_001bd16b;
    lStackY_ef8 = 1;
    lStackY_f00 = (long)close_cb_called;
    if (lStackY_f00 != 1) goto LAB_001bd17a;
    puStackY_f10 = (uv_loop_t *)0x1bd0f7;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    puStackY_f10 = (uv_loop_t *)0x1bd10b;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    puStackY_f10 = (uv_loop_t *)0x1bd115;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    lStackY_ef8 = 0;
    puStackY_f10 = (uv_loop_t *)0x1bd123;
    puVar8 = uv_default_loop();
    puStackY_f10 = (uv_loop_t *)0x1bd12b;
    iVar6 = uv_loop_close(puVar8);
    lStackY_f00 = (long)iVar6;
    if (lStackY_ef8 == lStackY_f00) {
      puStackY_f10 = (uv_loop_t *)0x1bd143;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStackY_f10 = (uv_loop_t *)0x1bd15c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd15c:
    puStackY_f10 = (uv_loop_t *)0x1bd16b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd16b:
    puStackY_f10 = (uv_loop_t *)0x1bd17a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd17a:
    puStackY_f10 = (uv_loop_t *)0x1bd189;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStackY_f10 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  puVar14 = auStackY_f40 + 0x20;
  auStackY_f40._24_8_ = (uv_close_cb)0x1bd1b0;
  puStackY_f10 = (uv_loop_t *)puVar10;
  init_process_options("spawn_helper4",kill_cb);
  auStackY_f40._24_8_ = (uv_close_cb)0x1bd1b5;
  puVar8 = uv_default_loop();
  auStackY_f40._24_8_ = (uv_close_cb)0x1bd1cb;
  iVar6 = uv_spawn(puVar8,&process,&options);
  auStackY_f40._40_8_ = SEXT48(iVar6);
  auStackY_f40._32_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStackY_f40._40_8_ == (uv__queue *)0x0) {
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd1ee;
    puVar8 = uv_default_loop();
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd1fd;
    iVar6 = uv_timer_init(puVar8,&timer);
    auStackY_f40._40_8_ = SEXT48(iVar6);
    auStackY_f40._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_f40._40_8_ != (uv__queue *)0x0) goto LAB_001bd32a;
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd235;
    iVar6 = uv_timer_start(&timer,timer_cb,500,0);
    auStackY_f40._40_8_ = SEXT48(iVar6);
    auStackY_f40._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_f40._40_8_ != (uv__queue *)0x0) goto LAB_001bd337;
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd258;
    puVar8 = uv_default_loop();
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd262;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    auStackY_f40._40_8_ = SEXT48(iVar6);
    auStackY_f40._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_f40._40_8_ != (uv__queue *)0x0) goto LAB_001bd344;
    auStackY_f40._40_8_ = (uv__queue *)0x1;
    auStackY_f40._32_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_f40._32_8_ != (uv__queue *)0x1) goto LAB_001bd351;
    auStackY_f40._40_8_ = (uv__queue *)0x2;
    auStackY_f40._32_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_f40._32_8_ != (uv__queue *)0x2) goto LAB_001bd35e;
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd2cb;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd2df;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd2e9;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    auStackY_f40._40_8_ = (uv__queue *)0x0;
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd2f7;
    puVar8 = uv_default_loop();
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd2ff;
    iVar6 = uv_loop_close(puVar8);
    auStackY_f40._32_8_ = SEXT48(iVar6);
    if (auStackY_f40._40_8_ == auStackY_f40._32_8_) {
      auStackY_f40._24_8_ = (uv_close_cb)0x1bd315;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd32a;
    run_test_spawn_and_kill_cold_1();
LAB_001bd32a:
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd337;
    run_test_spawn_and_kill_cold_2();
LAB_001bd337:
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd344;
    run_test_spawn_and_kill_cold_3();
LAB_001bd344:
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd351;
    run_test_spawn_and_kill_cold_4();
LAB_001bd351:
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd35e;
    run_test_spawn_and_kill_cold_5();
LAB_001bd35e:
    auStackY_f40._24_8_ = (uv_close_cb)0x1bd36b;
    run_test_spawn_and_kill_cold_6();
  }
  puVar15 = (uv_handle_t *)(auStackY_f40 + 0x28);
  auStackY_f40._24_8_ = kill_cb;
  run_test_spawn_and_kill_cold_7();
  auStackY_f40._24_8_ = (uv_close_cb)0x0;
  auStackY_f40._16_8_ = 0;
  auStackY_f40._8_8_ = puVar10;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  auStackY_f40._0_8_ = puVar14;
  if (puVar14 == (undefined1 *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd419;
    uv_close(puVar15,close_cb);
    auStackY_f40._0_8_ = SEXT48(*(int *)&puVar15[1].loop);
    if ((undefined1 *)auStackY_f40._0_8_ != (undefined1 *)0x0) {
      iVar6 = uv_kill(*(int *)&puVar15[1].loop,0);
      auStackY_f40._0_8_ = SEXT48(iVar6);
      if ((undefined1 *)auStackY_f40._0_8_ == (undefined1 *)0xfffffffffffffffd) {
        return;
      }
      goto LAB_001bd42b;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd419:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd42b:
  puVar15 = (uv_handle_t *)auStackY_f40;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar15,close_cb);
  return;
}

Assistant:

static void on_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  if (nread > 0) {
    output_used += nread;
  } else if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);
    uv_close((uv_handle_t*) tcp, close_cb);
  }
}